

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskWrite>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskWrite> *this,
               VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  ChannelOrder CVar1;
  void *pvVar2;
  ConstPixelBufferAccess *pCVar3;
  uint uVar4;
  deUint32 z;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  float fVar9;
  allocator<char> local_89;
  TestStatus *local_88;
  uint local_7c;
  ConstPixelBufferAccess local_78;
  ConstPixelBufferAccess *local_50;
  VkImageCreateInfo *local_48;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *local_40;
  long local_38;
  
  local_38 = (ulong)imageMSInfo->samples * 0x28;
  local_88 = __return_storage_ptr__;
  local_78.m_data = imageRSInfo;
  local_50 = dataRS;
  local_48 = imageMSInfo;
  local_40 = dataPerSample;
  for (uVar5 = 0; pCVar3 = local_50, pvVar2 = local_78.m_data, uVar5 < (imageMSInfo->extent).depth;
      uVar5 = uVar5 + 1) {
    for (uVar4 = 0; uVar4 < (imageMSInfo->extent).height; uVar4 = uVar4 + 1) {
      uVar6 = 0;
      while (uVar6 < (imageMSInfo->extent).width) {
        local_7c = uVar6;
        for (lVar7 = 0; local_38 != lVar7; lVar7 = lVar7 + 0x28) {
          tcu::ConstPixelBufferAccess::getPixelUint
                    (&local_78,
                     (int)(local_40->
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          )._M_impl.super__Vector_impl_data._M_start + (int)lVar7,local_7c,uVar4);
          CVar1 = local_78.m_format.order;
          if (((float)local_78.m_format.order != 0.0) &&
             ((float)local_78.m_format.order != 3.57331e-43)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,
                       "Expected color to be zero or saturated on the first channel",&local_89);
            tcu::TestStatus::fail(local_88,(string *)&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            if ((float)CVar1 != 3.57331e-43) {
              return local_88;
            }
          }
        }
        imageMSInfo = local_48;
        uVar6 = local_7c + 1;
      }
    }
  }
  uVar5 = 0;
  do {
    if (((VkExtent3D *)((long)pvVar2 + 0x1c))->depth <= uVar5) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Passed",&local_89);
      tcu::TestStatus::pass(local_88,(string *)&local_78);
LAB_00518940:
      std::__cxx11::string::~string((string *)&local_78);
      return local_88;
    }
    for (uVar4 = 0; uVar4 < ((VkExtent3D *)((long)pvVar2 + 0x1c))->height; uVar4 = uVar4 + 1) {
      uVar6 = 0;
      while (uVar6 < ((VkExtent3D *)((long)pvVar2 + 0x1c))->width) {
        tcu::ConstPixelBufferAccess::getPixel(&local_78,(int)pCVar3,uVar6,uVar4);
        fVar9 = (float)local_78.m_format.order + -0.5;
        uVar8 = -(uint)(-fVar9 <= fVar9);
        uVar6 = uVar6 + 1;
        if (0.02 < (float)(~uVar8 & (uint)-fVar9 | (uint)fVar9 & uVar8)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,
                     "Expected resolve color to be half intensity on the first channel",&local_89);
          tcu::TestStatus::fail(local_88,(string *)&local_78);
          goto LAB_00518940;
        }
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSampleMaskWrite>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																					 const vk::VkImageCreateInfo&						imageRSInfo,
																					 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																					 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
	{
		for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
		{
			const deUint32 firstComponent = dataPerSample[sampleNdx].getPixelUint(x, y, z)[0];

			if (firstComponent != 0u && firstComponent != 255u)
				return tcu::TestStatus::fail("Expected color to be zero or saturated on the first channel");
		}
	}

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const float firstComponent = dataRS.getPixel(x, y, z)[0];

		if (deFloatAbs(firstComponent - 0.5f) > 0.02f)
			return tcu::TestStatus::fail("Expected resolve color to be half intensity on the first channel");
	}

	return tcu::TestStatus::pass("Passed");
}